

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

void SplitUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
                 int dst_stride_v,int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_u = dst_u + ~height * dst_stride_u;
    dst_v = dst_v + ~height * dst_stride_v;
    dst_stride_u = -dst_stride_u;
    dst_stride_v = -dst_stride_v;
  }
  if (dst_stride_v == width && (dst_stride_u == width && width * 2 == src_stride_uv)) {
    width = iVar1 * width;
    src_stride_uv = 0;
    dst_stride_u = 0;
    dst_stride_v = 0;
    iVar1 = 1;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar3 = SplitUVRow_SSE2;
  }
  else {
    pcVar3 = SplitUVRow_Any_SSE2;
  }
  if ((uVar2 & 0x20) == 0) {
    pcVar3 = SplitUVRow_C;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0x1fU) == 0) {
    pcVar4 = SplitUVRow_AVX2;
  }
  else {
    pcVar4 = SplitUVRow_Any_AVX2;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    pcVar4 = pcVar3;
  }
  if (iVar1 != 0) {
    do {
      (*pcVar4)(src_uv,dst_u,dst_v,width);
      dst_u = dst_u + dst_stride_u;
      dst_v = dst_v + dst_stride_v;
      src_uv = src_uv + src_stride_uv;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void SplitUVPlane(const uint8_t* src_uv,
                  int src_stride_uv,
                  uint8_t* dst_u,
                  int dst_stride_u,
                  uint8_t* dst_v,
                  int dst_stride_v,
                  int width,
                  int height) {
  int y;
  void (*SplitUVRow)(const uint8_t* src_uv, uint8_t* dst_u, uint8_t* dst_v,
                     int width) = SplitUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_u = dst_u + (height - 1) * dst_stride_u;
    dst_v = dst_v + (height - 1) * dst_stride_v;
    dst_stride_u = -dst_stride_u;
    dst_stride_v = -dst_stride_v;
  }
  // Coalesce rows.
  if (src_stride_uv == width * 2 && dst_stride_u == width &&
      dst_stride_v == width) {
    width *= height;
    height = 1;
    src_stride_uv = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_SPLITUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SplitUVRow = SplitUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SplitUVRow = SplitUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitUVRow = SplitUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_NEON;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitUVRow = SplitUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SplitUVRow = SplitUVRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SplitUVRow = SplitUVRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Copy a row of UV.
    SplitUVRow(src_uv, dst_u, dst_v, width);
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
    src_uv += src_stride_uv;
  }
}